

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool __thiscall
Catch::Matchers::StringEqualsMatcher::match(StringEqualsMatcher *this,string *source)

{
  __type _Var1;
  string local_30;
  
  CasedString::adjustString(&local_30,&(this->super_StringMatcherBase).m_comparator,source);
  _Var1 = std::operator==(&local_30,&(this->super_StringMatcherBase).m_comparator.m_str);
  std::__cxx11::string::~string((string *)&local_30);
  return _Var1;
}

Assistant:

bool StringEqualsMatcher::match(std::string const &source) const {
            return m_comparator.adjustString(source) == m_comparator.m_str;
        }